

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.hpp
# Opt level: O0

RotationY<std::complex<float>_> *
qclab::qgates::operator*
          (RotationY<std::complex<float>_> *__return_storage_ptr__,
          RotationY<std::complex<float>_> *lhs,RotationY<std::complex<float>_> *rhs)

{
  int iVar1;
  int iVar2;
  RotationY<std::complex<float>_> *rhs_local;
  RotationY<std::complex<float>_> *lhs_local;
  
  iVar1 = QGate1<std::complex<float>_>::qubit((QGate1<std::complex<float>_> *)lhs);
  iVar2 = (*(rhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])();
  if (iVar1 == iVar2) {
    RotationY<std::complex<float>_>::operator*=(lhs,rhs);
    RotationY<std::complex<float>_>::RotationY(__return_storage_ptr__,lhs);
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationY.hpp"
                ,0xb1,"RotationY<T> qclab::qgates::operator*(RotationY<T>, const RotationY<T> &)");
}

Assistant:

RotationY< T > operator*( RotationY< T > lhs ,
                                         const RotationY< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs *= rhs ;
          return lhs ;
        }